

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wputils.c
# Opt level: O2

uint32_t read_next_header(read_stream infile,WavpackHeader *wphdr)

{
  long lVar1;
  int32_t iVar2;
  ulong uVar3;
  uint32_t uVar4;
  ulong uVar5;
  int iVar6;
  long in_FS_OFFSET;
  char buffer [32];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar4 = 0;
  uVar3 = 0x20;
  do {
    uVar5 = 0;
    if (uVar3 < 0x20) {
      uVar5 = (ulong)(0x20 - (int)uVar3);
      __memcpy_chk(buffer,buffer + uVar3,uVar5,0x20);
    }
    iVar6 = 0x20 - (int)uVar5;
    iVar2 = (*infile)(buffer + uVar5,iVar6);
    if (iVar2 != iVar6) break;
    uVar3 = 1;
    if ((buffer[0] == 'w') && (buffer[1] == 'v')) {
      uVar3 = 2;
      if (buffer[2] == 'p') {
        uVar3 = 3;
        if (buffer[3] == 'k') {
          uVar3 = 4;
          if (((((buffer[4] & 1U) == 0) && (buffer[6] < '\x10')) && (buffer[7] == '\0')) &&
             ((buffer[9] == '\x04' && ((byte)(buffer[8] - 2U) < 0xf)))) {
            uVar3 = (ulong)CONCAT16(buffer[6],CONCAT15(buffer[5],CONCAT14(buffer[4],0x6b707677)));
            *(undefined8 *)&wphdr->block_index = buffer._16_8_;
            *(undefined8 *)&wphdr->flags = buffer._24_8_;
            wphdr->ckID[0] = (char)uVar3;
            wphdr->ckID[1] = (char)(uVar3 >> 8);
            wphdr->ckID[2] = (char)(uVar3 >> 0x10);
            wphdr->ckID[3] = (char)(uVar3 >> 0x18);
            wphdr->ckSize = (int)(uVar3 >> 0x20);
            wphdr->version = CONCAT11(4,buffer[8]);
            wphdr->track_no = (char)buffer._10_6_;
            wphdr->index_no = SUB61(buffer._10_6_,1);
            wphdr->total_samples = SUB64(buffer._10_6_,2);
            little_endian_to_native(wphdr,"4LS2LLLLL");
            goto LAB_001a1c4a;
          }
        }
      }
    }
    for (; (uVar3 != 0x20 && (buffer[uVar3] != 'w')); uVar3 = uVar3 + 1) {
    }
    uVar4 = uVar4 + (int)uVar3;
  } while (uVar4 < 0x100001);
  uVar4 = 0xffffffff;
LAB_001a1c4a:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return uVar4;
  }
  __stack_chk_fail();
}

Assistant:

static uint32_t read_next_header (read_stream infile, WavpackHeader *wphdr)
{
    char buffer [sizeof (*wphdr)], *sp = buffer + sizeof (*wphdr), *ep = sp;
    uint32_t bytes_skipped = 0;
    int bleft;

    while (1) {
        if (sp < ep) {
            bleft = ep - sp;
            memcpy (buffer, sp, bleft);
        }
        else
            bleft = 0;

        if (infile (buffer + bleft, sizeof (*wphdr) - bleft) != (int32_t) sizeof (*wphdr) - bleft)
            return -1;

        sp = buffer;

        if (*sp++ == 'w' && *sp == 'v' && *++sp == 'p' && *++sp == 'k' &&
            !(*++sp & 1) && sp [2] < 16 && !sp [3] && sp [5] == 4 &&
            sp [4] >= (MIN_STREAM_VERS & 0xff) && sp [4] <= (MAX_STREAM_VERS & 0xff)) {
                memcpy (wphdr, buffer, sizeof (*wphdr));
                little_endian_to_native (wphdr, WavpackHeaderFormat);
                return bytes_skipped;
            }

        while (sp < ep && *sp != 'w')
            sp++;

        if ((bytes_skipped += sp - buffer) > 1048576L)
            return -1;
    }
}